

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O3

SpatialAcc * __thiscall
iDynTree::Axis::getTranslationSpatialAcc
          (SpatialAcc *__return_storage_ptr__,Axis *this,double d2dist)

{
  double dVar1;
  SpatialAcc *ret;
  
  dVar1 = (this->direction).super_Vector3.m_data[1];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[0] =
       d2dist * (this->direction).super_Vector3.m_data[0];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[1] =
       d2dist * dVar1;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.m_data[2] =
       d2dist * (this->direction).super_Vector3.m_data[2];
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[0] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[1] = 0.0;
  (__return_storage_ptr__->super_SpatialMotionVector).
  super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.super_Vector3.m_data[2] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

SpatialAcc Axis::getTranslationSpatialAcc(const double d2dist) const
    {
        SpatialAcc ret;

        Eigen::Map<Eigen::Vector3d> lin(ret.getLinearVec3().data());
        Eigen::Map<Eigen::Vector3d> ang(ret.getAngularVec3().data());

        Eigen::Map<const Eigen::Vector3d> dir(direction.data());
        Eigen::Map<const Eigen::Vector3d> orig(origin.data());

        lin = dir*d2dist;
        ang << 0,0,0;

        return ret;
    }